

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O1

void __thiscall CLI::App::exit(App *this,int __status)

{
  long lVar1;
  ostream *in_RCX;
  ostream *in_RDX;
  undefined4 in_register_00000034;
  Error *pEVar2;
  _Alloc_hider _Var3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  string local_90;
  string local_70;
  string local_50;
  App *local_30;
  
  pEVar2 = (Error *)CONCAT44(in_register_00000034,__status);
  lVar1 = __dynamic_cast(pEVar2,&Error::typeinfo,&RuntimeError::typeinfo);
  if (lVar1 == 0) {
    lVar1 = __dynamic_cast(pEVar2,&Error::typeinfo,&CallForHelp::typeinfo);
    if (lVar1 == 0) {
      lVar1 = __dynamic_cast(pEVar2,&Error::typeinfo,&CallForAllHelp::typeinfo,0);
      if (lVar1 == 0) {
        if (pEVar2->actual_exit_code == 0) {
          return;
        }
        if ((this->failure_message_).super__Function_base._M_manager == (_Manager_type)0x0) {
          return;
        }
        local_30 = this;
        (*(this->failure_message_)._M_invoker)
                  (&local_90,(_Any_data *)&this->failure_message_,&local_30,pEVar2);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  (in_RCX,local_90._M_dataplus._M_p,local_90._M_string_length);
        ::std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p == &local_90.field_2) {
          return;
        }
        operator_delete(local_90._M_dataplus._M_p);
        return;
      }
      paVar4 = &local_70.field_2;
      local_70._M_dataplus._M_p = (pointer)paVar4;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
      help(&local_90,this,&local_70,All);
      ::std::__ostream_insert<char,std::char_traits<char>>
                (in_RDX,local_90._M_dataplus._M_p,local_90._M_string_length);
      _Var3._M_p = local_70._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
        _Var3._M_p = local_70._M_dataplus._M_p;
      }
    }
    else {
      paVar4 = &local_50.field_2;
      local_50._M_dataplus._M_p = (pointer)paVar4;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
      help(&local_90,this,&local_50,Normal);
      ::std::__ostream_insert<char,std::char_traits<char>>
                (in_RDX,local_90._M_dataplus._M_p,local_90._M_string_length);
      _Var3._M_p = local_50._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
        _Var3._M_p = local_50._M_dataplus._M_p;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var3._M_p != paVar4) {
      operator_delete(_Var3._M_p);
    }
  }
  return;
}

Assistant:

int exit(const Error &e, std::ostream &out = std::cout, std::ostream &err = std::cerr) const {

        /// Avoid printing anything if this is a CLI::RuntimeError
        if(dynamic_cast<const CLI::RuntimeError *>(&e) != nullptr)
            return e.get_exit_code();

        if(dynamic_cast<const CLI::CallForHelp *>(&e) != nullptr) {
            out << help();
            return e.get_exit_code();
        }

        if(dynamic_cast<const CLI::CallForAllHelp *>(&e) != nullptr) {
            out << help("", AppFormatMode::All);
            return e.get_exit_code();
        }

        if(e.get_exit_code() != static_cast<int>(ExitCodes::Success)) {
            if(failure_message_)
                err << failure_message_(this, e) << std::flush;
        }

        return e.get_exit_code();
    }